

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

void __thiscall Controller::Controller(Controller *this)

{
  unique_ptr<UndoMove,_std::default_delete<UndoMove>_> local_38 [3];
  undefined4 local_20;
  BoardMode local_1c;
  unique_ptr<Board,_std::default_delete<Board>_> local_18;
  Controller *local_10;
  Controller *this_local;
  
  local_10 = this;
  std::unique_ptr<Board,std::default_delete<Board>>::unique_ptr<std::default_delete<Board>,void>
            ((unique_ptr<Board,std::default_delete<Board>> *)this);
  std::unique_ptr<ImageProvider,std::default_delete<ImageProvider>>::
  unique_ptr<std::default_delete<ImageProvider>,void>
            ((unique_ptr<ImageProvider,std::default_delete<ImageProvider>> *)&this->imageProvider);
  std::unique_ptr<UndoMove,std::default_delete<UndoMove>>::
  unique_ptr<std::default_delete<UndoMove>,void>
            ((unique_ptr<UndoMove,std::default_delete<UndoMove>> *)&this->undoMoveService);
  local_1c = NUMERIC;
  local_20 = 0;
  std::make_unique<Board,BoardSize,BoardMode>((BoardSize *)&local_18,&local_1c);
  std::unique_ptr<Board,_std::default_delete<Board>_>::operator=(&this->board,&local_18);
  std::unique_ptr<Board,_std::default_delete<Board>_>::~unique_ptr(&local_18);
  std::make_unique<UndoMove>();
  std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::operator=
            (&this->undoMoveService,local_38);
  std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::~unique_ptr(local_38);
  return;
}

Assistant:

Controller::Controller() 
{
    board = std::make_unique<Board>( BoardSize::FOUR, BoardMode::NUMERIC );
    undoMoveService = std::make_unique<UndoMove>();
}